

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void __thiscall
SFFile::AddPresetGenerators(SFFile *this,SFGenComposite *composite,int start,int stop,bool *gen_set)

{
  ushort uVar1;
  int iVar2;
  anon_union_2_2_c2a07933_for_SFGenComposite_0 local_40;
  int local_3c;
  int added;
  int i;
  GenDef *def;
  SFGenList *gen;
  bool *gen_set_local;
  int stop_local;
  int start_local;
  SFGenComposite *composite_local;
  SFFile *this_local;
  
  def = (GenDef *)(this->PresetGenerators + (stop + -1));
  local_3c = stop - start;
  do {
    if (local_3c == 0) {
      return;
    }
    if (((ushort)def->Min < 0x3b) && ((gen_set[(ushort)def->Min] & 1U) == 0)) {
      uVar1 = def->Min;
      if ((GenDefs[uVar1].StructIndex < 0x33) && ((GenDefs[uVar1].Flags & 1) == 0)) {
        iVar2 = (int)(short)(&composite->field_0)[GenDefs[uVar1].StructIndex] + (int)def->Max;
        if ((iVar2 < -0x7fff) && ((GenDefs[uVar1].Flags & 0x10) != 0)) {
          local_40 = (anon_union_2_2_c2a07933_for_SFGenComposite_0)0x8000;
        }
        else {
          iVar2 = clamp<int>(iVar2,(int)GenDefs[uVar1].Min,(int)GenDefs[uVar1].Max);
          local_40 = SUB42(iVar2,0);
        }
        (&composite->field_0)[GenDefs[uVar1].StructIndex] = local_40;
        gen_set[(ushort)def->Min] = true;
        if (def->Min == 0x29) {
          return;
        }
      }
    }
    local_3c = local_3c + -1;
    def = (GenDef *)&def[-1].Max;
  } while( true );
}

Assistant:

void SFFile::AddPresetGenerators(SFGenComposite *composite, int start, int stop, bool gen_set[GEN_NumGenerators])
{
	// Proceed from last to first; later generators override earlier ones.
	SFGenList *gen = &PresetGenerators[stop - 1];
	const GenDef *def;

	for (int i = stop - start; i != 0; --i, --gen)
	{
		if (gen->Oper >= GEN_NumGenerators)
		{ // Unknown generator.
			continue;
		}
		if (gen_set[gen->Oper])
		{ // Generator was already set.
			continue;
		}
		def = &GenDefs[gen->Oper];
		if (def->StructIndex >= sizeof(SFGenComposite)/2)
		{ // Generator is either unused or ignored.
			continue;
		}
		if (def->Flags & GENF_InstrOnly)
		{ // Generator is not valid at the preset level.
			continue;
		}
		// Add to instrument/default generator.
		int added = ((SWORD *)composite)[def->StructIndex] + gen->Amount;
		// Clamp to proper range.
		if (added <= -32768 && def->Flags & GENF_32768_Ok)
		{
			added = -32768;
		}
		else
		{
			added = clamp<int>(added, def->Min, def->Max);
		}
		((SWORD *)composite)[def->StructIndex] = added;
		gen_set[gen->Oper] = true;
		if (gen->Oper == GEN_instrument)
		{ // Anything past the instrument generator is ignored.
			break;
		}
	}
}